

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

long ov_read_filter(OggVorbis_File *vf,char *buffer,int length,int bigendianp,int word,int sgned,
                   int *bitstream,_func_void_float_ptr_ptr_long_long_void_ptr *filter,
                   void *filter_param)

{
  uint uVar1;
  float *pfVar2;
  int iVar3;
  vorbis_info *pvVar4;
  vorbis_dsp_state *pvVar5;
  long lVar6;
  ulong uVar7;
  int extraout_EDX;
  ulong extraout_RDX;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  short *psVar11;
  long lVar12;
  long lVar13;
  float **pcm;
  long local_48;
  int local_3c;
  vorbis_dsp_state *local_38;
  
  uVar10 = (ulong)(uint)length;
  iVar3 = vf->ready_state;
  lVar13 = -0x83;
  if (0 < word && 1 < iVar3) {
    local_48 = CONCAT44(local_48._4_4_,length);
    pvVar5 = &vf->vd;
    local_3c = bigendianp;
    local_38 = pvVar5;
    while( true ) {
      iVar8 = (int)uVar10;
      if ((iVar3 == 4) &&
         (iVar3 = vorbis_synthesis_pcmout(local_38,&pcm), iVar8 = extraout_EDX, iVar3 != 0)) {
        lVar13 = (long)iVar3;
        if (iVar3 < 1) {
          return lVar13;
        }
        pvVar4 = ov_info(vf,-1);
        uVar1 = pvVar4->channels;
        lVar12 = (long)(int)uVar1;
        if (uVar1 - 0x100 < 0xffffff01) {
          return -0x83;
        }
        lVar6 = (ulong)(uint)word * lVar12;
        if ((long)(int)local_48 / lVar6 < lVar13) {
          lVar13 = (long)(int)local_48 / lVar6;
        }
        if (lVar13 < 1) {
          return -0x83;
        }
        local_48 = lVar6;
        if (filter != (_func_void_float_ptr_ptr_long_long_void_ptr *)0x0) {
          (*filter)(pcm,lVar12,lVar13,filter_param);
        }
        if (word == 1) {
          for (lVar12 = 0; lVar12 != lVar13; lVar12 = lVar12 + 1) {
            for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
              iVar3 = (int)ROUND(pcm[uVar10][lVar12] * 128.0);
              if (iVar3 < -0x7f) {
                iVar3 = -0x80;
              }
              if (0x7e < iVar3) {
                iVar3 = 0x7f;
              }
              buffer[uVar10] = (char)iVar3 + (sgned == 0) * -0x80;
            }
            buffer = buffer + uVar10;
          }
        }
        else {
          uVar10 = (ulong)uVar1;
          iVar3 = (uint)(sgned == 0) * 0x8000;
          if (local_3c == 0) {
            if (sgned == 0) {
              for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
                pfVar2 = pcm[uVar7];
                psVar11 = (short *)buffer;
                for (lVar6 = 0; lVar13 != lVar6; lVar6 = lVar6 + 1) {
                  iVar8 = (int)ROUND(pfVar2[lVar6] * 32768.0);
                  if (iVar8 < -0x7fff) {
                    iVar8 = -0x8000;
                  }
                  if (0x7ffe < iVar8) {
                    iVar8 = 0x7fff;
                  }
                  *psVar11 = (short)iVar8 + (short)iVar3;
                  psVar11 = psVar11 + lVar12;
                }
                buffer = (char *)((long)buffer + 2);
              }
            }
            else {
              for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
                pfVar2 = pcm[uVar7];
                pcVar9 = buffer;
                for (lVar6 = 0; lVar13 != lVar6; lVar6 = lVar6 + 1) {
                  iVar3 = (int)ROUND(pfVar2[lVar6] * 32768.0);
                  if (iVar3 < -0x7fff) {
                    iVar3 = -0x8000;
                  }
                  if (0x7ffe < iVar3) {
                    iVar3 = 0x7fff;
                  }
                  *(short *)pcVar9 = (short)iVar3;
                  pcVar9 = pcVar9 + lVar12 * 2;
                }
                buffer = buffer + 2;
              }
            }
          }
          else {
            for (lVar12 = 0; lVar12 != lVar13; lVar12 = lVar12 + 1) {
              for (lVar6 = 0; uVar10 * 2 != lVar6; lVar6 = lVar6 + 2) {
                iVar8 = (int)ROUND(*(float *)(*(long *)((long)pcm + lVar6 * 4) + lVar12 * 4) *
                                   32768.0);
                if (iVar8 < -0x7fff) {
                  iVar8 = -0x8000;
                }
                if (0x7ffe < iVar8) {
                  iVar8 = 0x7fff;
                }
                buffer[lVar6] = (char)((uint)(iVar8 + iVar3) >> 8);
                buffer[lVar6 + 1] = (char)iVar8;
              }
              buffer = buffer + lVar6;
            }
          }
        }
        vorbis_synthesis_read(local_38,(int)lVar13);
        iVar3 = vorbis_synthesis_halfrate_p(vf->vi);
        vf->pcm_offset = vf->pcm_offset + (lVar13 << ((byte)iVar3 & 0x3f));
        if (bitstream != (int *)0x0) {
          *bitstream = vf->current_link;
        }
        return lVar13 * local_48;
      }
      iVar3 = _fetch_and_process_packet(vf,(ogg_packet *)0x1,iVar8,(int)pvVar5);
      if (iVar3 == -2) {
        return 0;
      }
      if (iVar3 < 1) break;
      iVar3 = vf->ready_state;
      uVar10 = extraout_RDX;
    }
    lVar13 = (long)iVar3;
  }
  return lVar13;
}

Assistant:

long ov_read_filter(OggVorbis_File *vf,char *buffer,int length,
                    int bigendianp,int word,int sgned,int *bitstream,
                    void (*filter)(float **pcm,long channels,long samples,void *filter_param),void *filter_param){
  int i,j;
  int host_endian = host_is_big_endian();
  int hs;

  float **pcm;
  long samples;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(word<=0)return(OV_EINVAL);

  while(1){
    if(vf->ready_state==INITSET){
      samples=vorbis_synthesis_pcmout(&vf->vd,&pcm);
      if(samples)break;
    }

    /* suck in another packet */
    {
      int ret=_fetch_and_process_packet(vf,NULL,1,1);
      if(ret==OV_EOF)
        return(0);
      if(ret<=0)
        return(ret);
    }

  }

  if(samples>0){

    /* yay! proceed to pack data into the byte buffer */

    long channels=ov_info(vf,-1)->channels;
    long bytespersample=word * channels;
    vorbis_fpu_control fpu;

    if(channels<1||channels>255)return(OV_EINVAL);
    if(samples>length/bytespersample)samples=length/bytespersample;

    if(samples <= 0)
      return OV_EINVAL;

    /* Here. */
    if(filter)
      filter(pcm,channels,samples,filter_param);

    /* a tight loop to pack each size */
    {
      int val;
      if(word==1){
        int off=(sgned?0:128);
        vorbis_fpu_setround(&fpu);
        for(j=0;j<samples;j++)
          for(i=0;i<channels;i++){
            val=vorbis_ftoi(pcm[i][j]*128.f);
            if(val>127)val=127;
            else if(val<-128)val=-128;
            *buffer++=val+off;
          }
        vorbis_fpu_restore(fpu);
      }else{
        int off=(sgned?0:32768);

        if(host_endian==bigendianp){
          if(sgned){

            vorbis_fpu_setround(&fpu);
            for(i=0;i<channels;i++) { /* It's faster in this order */
              float *src=pcm[i];
              short *dest=((short *)buffer)+i;
              for(j=0;j<samples;j++) {
                val=vorbis_ftoi(src[j]*32768.f);
                if(val>32767)val=32767;
                else if(val<-32768)val=-32768;
                *dest=val;
                dest+=channels;
              }
            }
            vorbis_fpu_restore(fpu);

          }else{

            vorbis_fpu_setround(&fpu);
            for(i=0;i<channels;i++) {
              float *src=pcm[i];
              short *dest=((short *)buffer)+i;
              for(j=0;j<samples;j++) {
                val=vorbis_ftoi(src[j]*32768.f);
                if(val>32767)val=32767;
                else if(val<-32768)val=-32768;
                *dest=val+off;
                dest+=channels;
              }
            }
            vorbis_fpu_restore(fpu);

          }
        }else if(bigendianp){

          vorbis_fpu_setround(&fpu);
          for(j=0;j<samples;j++)
            for(i=0;i<channels;i++){
              val=vorbis_ftoi(pcm[i][j]*32768.f);
              if(val>32767)val=32767;
              else if(val<-32768)val=-32768;
              val+=off;
              *buffer++=(val>>8);
              *buffer++=(val&0xff);
            }
          vorbis_fpu_restore(fpu);

        }else{
          int val;
          vorbis_fpu_setround(&fpu);
          for(j=0;j<samples;j++)
            for(i=0;i<channels;i++){
              val=vorbis_ftoi(pcm[i][j]*32768.f);
              if(val>32767)val=32767;
              else if(val<-32768)val=-32768;
              val+=off;
              *buffer++=(val&0xff);
              *buffer++=(val>>8);
                  }
          vorbis_fpu_restore(fpu);

        }
      }
    }

    vorbis_synthesis_read(&vf->vd,samples);
    hs=vorbis_synthesis_halfrate_p(vf->vi);
    vf->pcm_offset+=(samples<<hs);
    if(bitstream)*bitstream=vf->current_link;
    return(samples*bytespersample);
  }else{
    return(samples);
  }
}